

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool list_exec(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  char *pcVar1;
  size_t sVar2;
  gravity_fiber_t *pgVar3;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  gravity_value_t *pgVar5;
  undefined6 in_register_00000012;
  uint32_t n;
  gravity_class_t *pgVar6;
  char *pcVar7;
  _Bool _Var8;
  gravity_value_t value;
  char _buffer [4096];
  char local_1038 [40];
  undefined7 uStack_1010;
  undefined4 uStack_1009;
  
  if (((int)CONCAT62(in_register_00000012,nargs) == 2) && (args[1].isa == gravity_class_int)) {
    n = *(uint32_t *)&args[1].field_1;
    aVar4.p = (gravity_object_t *)gravity_list_new(vm,n);
    _Var8 = (gravity_list_t *)aVar4.n != (gravity_list_t *)0x0;
    if (_Var8) {
      for (; n != 0; n = n - 1) {
        pcVar1 = (aVar4.p)->identifier;
        if ((char *)((gravity_value_r *)&(aVar4.p)->objclass)->n == pcVar1) {
          pcVar7 = (char *)((long)pcVar1 * 2);
          if (pcVar1 == (char *)0x0) {
            pcVar7 = (char *)0x8;
          }
          (aVar4.p)->identifier = pcVar7;
          pgVar5 = (gravity_value_t *)
                   realloc(*(gravity_value_t **)&(aVar4.p)->has_outer,(long)pcVar7 << 4);
          *(gravity_value_t **)&(aVar4.p)->has_outer = pgVar5;
        }
        sVar2 = ((gravity_value_r *)&(aVar4.p)->objclass)->n;
        pgVar5 = *(gravity_value_t **)&(aVar4.p)->has_outer;
        ((gravity_value_r *)&(aVar4.p)->objclass)->n = sVar2 + 1;
        pgVar5[sVar2].isa = gravity_class_null;
        pgVar5[sVar2].field_1.n = 0;
      }
      pgVar6 = (aVar4.p)->isa;
      goto LAB_0011c4e9;
    }
    snprintf(local_1038,0x1000,"Maximum List allocation size reached (%d).",0x400000);
    pgVar3 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar3,local_1038);
  }
  else {
    builtin_strncpy(local_1038 + 0x20,"ment of ",8);
    uStack_1010 = 0x78655f7473696c;
    builtin_strncpy(local_1038 + 0x10,"expected as argu",0x10);
    builtin_strncpy(local_1038,"An Int value is ",0x10);
    uStack_1009 = 0x2e6365;
    pgVar3 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar3,local_1038);
  }
  _Var8 = false;
  aVar4.n = 0;
  pgVar6 = gravity_class_null;
LAB_0011c4e9:
  value.field_1.n = aVar4.n;
  value.isa = pgVar6;
  gravity_vm_setslot(vm,value,rindex);
  return _Var8;
}

Assistant:

static bool list_exec (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if ((nargs != 2) || (!VALUE_ISA_INT(GET_VALUE(1)))) RETURN_ERROR("An Int value is expected as argument of list_exec.");

    uint32_t n = (uint32_t)VALUE_AS_INT(GET_VALUE(1));
    gravity_list_t *list = gravity_list_new(vm, n);
    if (!list) RETURN_ERROR("Maximum List allocation size reached (%d).", MAX_ALLOCATION);

    for (uint32_t i=0; i<n; ++i) {
        marray_push(gravity_value_t, list->array, VALUE_FROM_NULL);
    }

    RETURN_VALUE(VALUE_FROM_OBJECT(list), rindex);
}